

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool __thiscall
testing::internal::UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
          (UntypedFunctionMockerBase *this)

{
  bool bVar1;
  pointer this_00;
  ostream *poVar2;
  char *pcVar3;
  UntypedExpectations expectations_to_delete;
  stringstream ss;
  ExpectationBase *untyped_expectation;
  const_iterator it;
  bool expectations_met;
  string *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  char *in_stack_fffffffffffffda8;
  vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
  *__x;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  ostream *in_stack_fffffffffffffdb8;
  ExpectationBase *in_stack_fffffffffffffdc0;
  ExpectationBase *in_stack_fffffffffffffdd0;
  ostream *local_228;
  vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
  local_200;
  string local_1e8 [48];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  ExpectationBase *local_30;
  linked_ptr<testing::internal::ExpectationBase> *local_28;
  linked_ptr<testing::internal::ExpectationBase> *local_20;
  __normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
  local_18;
  byte local_9;
  
  MutexBase::AssertHeld((MutexBase *)in_stack_fffffffffffffdd0);
  local_9 = 1;
  local_20 = (linked_ptr<testing::internal::ExpectationBase> *)
             std::
             vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
             ::begin((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                      *)in_stack_fffffffffffffd98);
  __gnu_cxx::
  __normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>const*,std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>>>>
  ::__normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>*>
            ((__normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (__normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
              *)in_stack_fffffffffffffd98);
  while( true ) {
    local_28 = (linked_ptr<testing::internal::ExpectationBase> *)
               std::
               vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
               ::end((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                      *)in_stack_fffffffffffffd98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       (__normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
                        *)in_stack_fffffffffffffd98);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
              ::operator->(&local_18);
    local_30 = linked_ptr<testing::internal::ExpectationBase>::get(this_00);
    bVar1 = ExpectationBase::IsOverSaturated
                      ((ExpectationBase *)
                       CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    if (bVar1) {
      local_9 = 0;
    }
    else {
      bVar1 = ExpectationBase::IsSatisfied
                        ((ExpectationBase *)
                         CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      if (!bVar1) {
        local_9 = 0;
        std::__cxx11::stringstream::stringstream(local_1b8);
        poVar2 = std::operator<<(local_1a8,"Actual function call count doesn\'t match ");
        pcVar3 = ExpectationBase::source_text((ExpectationBase *)0x14471e);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::operator<<(poVar2,"...\n");
        local_228 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x1b8) {
          local_228 = local_1a8;
        }
        in_stack_fffffffffffffdd0 = local_30;
        (*local_30->_vptr_ExpectationBase[2])(local_30,local_228);
        in_stack_fffffffffffffdc0 = local_30;
        ExpectationBase::DescribeCallCountTo(local_30,in_stack_fffffffffffffdb8);
        in_stack_fffffffffffffdb8 = (ostream *)ExpectationBase::file(local_30);
        in_stack_fffffffffffffdb4 = ExpectationBase::line(local_30);
        std::__cxx11::stringstream::str();
        Expect(SUB41((uint)in_stack_fffffffffffffdb4 >> 0x18,0),in_stack_fffffffffffffda8,
               in_stack_fffffffffffffda4,in_stack_fffffffffffffd98);
        std::__cxx11::string::~string(local_1e8);
        std::__cxx11::stringstream::~stringstream(local_1b8);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
    ::operator++(&local_18);
  }
  __x = &local_200;
  std::
  vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
  ::vector((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
            *)0x1448bc);
  std::
  vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
  ::swap((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
          *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),__x);
  MutexBase::Unlock((MutexBase *)in_stack_fffffffffffffdc0);
  std::
  vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
  ::clear((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
           *)0x1448e7);
  MutexBase::Lock((MutexBase *)in_stack_fffffffffffffdd0);
  std::
  vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
  ::~vector((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
             *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  return (bool)(local_9 & 1);
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  bool expectations_met = true;
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    ExpectationBase* const untyped_expectation = it->get();
    if (untyped_expectation->IsOverSaturated()) {
      // There was an upper-bound violation.  Since the error was
      // already reported when it occurred, there is no need to do
      // anything here.
      expectations_met = false;
    } else if (!untyped_expectation->IsSatisfied()) {
      expectations_met = false;
      ::std::stringstream ss;
      ss  << "Actual function call count doesn't match "
          << untyped_expectation->source_text() << "...\n";
      // No need to show the source file location of the expectation
      // in the description, as the Expect() call that follows already
      // takes care of it.
      untyped_expectation->MaybeDescribeExtraMatcherTo(&ss);
      untyped_expectation->DescribeCallCountTo(&ss);
      Expect(false, untyped_expectation->file(),
             untyped_expectation->line(), ss.str());
    }
  }

  // Deleting our expectations may trigger other mock objects to be deleted, for
  // example if an action contains a reference counted smart pointer to that
  // mock object, and that is the last reference. So if we delete our
  // expectations within the context of the global mutex we may deadlock when
  // this method is called again. Instead, make a copy of the set of
  // expectations to delete, clear our set within the mutex, and then clear the
  // copied set outside of it.
  UntypedExpectations expectations_to_delete;
  untyped_expectations_.swap(expectations_to_delete);

  g_gmock_mutex.Unlock();
  expectations_to_delete.clear();
  g_gmock_mutex.Lock();

  return expectations_met;
}